

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O0

void server_bpp_output_raw_data_callback(void *vctx)

{
  size_t sVar1;
  ptrlen pVar2;
  void *local_30;
  ptrlen data;
  size_t backlog;
  server *srv;
  void *vctx_local;
  
  if (*(long *)((long)vctx + 0xd8) != 0) {
    do {
      sVar1 = bufchain_size((bufchain *)((long)vctx + 0x28));
      if (sVar1 == 0) {
        if ((*(byte *)((long)vctx + 0x68) & 1) == 0) {
          return;
        }
        sk_close(*(Socket **)((long)vctx + 0xd8));
        *(undefined8 *)((long)vctx + 0xd8) = 0;
        queue_toplevel_callback(ssh_server_free_callback,vctx);
        return;
      }
      pVar2 = bufchain_prefix((bufchain *)((long)vctx + 0x28));
      local_30 = pVar2.ptr;
      data.ptr = (void *)pVar2.len;
      if (*(long *)((long)vctx + 0xa8) != 0) {
        log_packet(*(LogContext **)((long)vctx + 0xa8),1,-1,(char *)0x0,local_30,(size_t)data.ptr,0,
                   (logblank_t *)0x0,(unsigned_long *)0x0,0,(char *)0x0);
      }
      sVar1 = sk_write(*(Socket **)((long)vctx + 0xd8),local_30,(size_t)data.ptr);
      bufchain_consume((bufchain *)((long)vctx + 0x28),(size_t)data.ptr);
    } while (sVar1 < 0x8001);
  }
  return;
}

Assistant:

static void server_bpp_output_raw_data_callback(void *vctx)
{
    server *srv = (server *)vctx;

    if (!srv->socket)
        return;

    while (bufchain_size(&srv->out_raw) > 0) {
        size_t backlog;

        ptrlen data = bufchain_prefix(&srv->out_raw);

        if (srv->logctx)
            log_packet(srv->logctx, PKT_OUTGOING, -1, NULL, data.ptr, data.len,
                       0, NULL, NULL, 0, NULL);
        backlog = sk_write(srv->socket, data.ptr, data.len);

        bufchain_consume(&srv->out_raw, data.len);

        if (backlog > SSH_MAX_BACKLOG) {
#ifdef FIXME
            ssh_throttle_all(ssh, 1, backlog);
#endif
            return;
        }
    }

    if (srv->pending_close) {
        sk_close(srv->socket);
        srv->socket = NULL;
        queue_toplevel_callback(ssh_server_free_callback, srv);
    }
}